

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheet.cpp
# Opt level: O2

DecoratorPtrList * __thiscall
Rml::StyleSheet::InstanceDecorators
          (StyleSheet *this,RenderManager *render_manager,DecoratorDeclarationList *declaration_list
          ,PropertySource *source)

{
  pointer pDVar1;
  DecoratorInstancer *pDVar2;
  int iVar3;
  DecoratorPtrList *this_00;
  NodePtr pDVar4;
  RenderManager *pRVar5;
  pointer key_00;
  char *pcVar6;
  ulong uVar7;
  vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>
  *this_01;
  iterator iVar8;
  const_iterator cVar9;
  SharedPtr<Decorator> decorator;
  shared_ptr<const_Rml::Decorator> local_a0;
  PropertySource *local_90;
  vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>
  *local_88;
  String *local_80;
  RenderManager *local_78;
  RmlUiAssertNonrecursive rmlui_nonrecursive;
  String key;
  __shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_78 = render_manager;
  RmlUiAssertNonrecursive::RmlUiAssertNonrecursive
            (&rmlui_nonrecursive,&InstanceDecorators::rmlui_nonrecursive_entered);
  if ((InstanceDecorators(Rml::RenderManager&,Rml::DecoratorDeclarationList_const&,Rml::PropertySource_const*)
       ::non_cached_decorator_list == '\0') &&
     (iVar3 = __cxa_guard_acquire(&InstanceDecorators(Rml::RenderManager&,Rml::DecoratorDeclarationList_const&,Rml::PropertySource_const*)
                                   ::non_cached_decorator_list), iVar3 != 0)) {
    InstanceDecorators::non_cached_decorator_list.
    super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    InstanceDecorators::non_cached_decorator_list.
    super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    InstanceDecorators::non_cached_decorator_list.
    super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __cxa_atexit(::std::
                 vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                 ::~vector,&InstanceDecorators::non_cached_decorator_list,&__dso_handle);
    __cxa_guard_release(&InstanceDecorators(Rml::RenderManager&,Rml::DecoratorDeclarationList_const&,Rml::PropertySource_const*)
                         ::non_cached_decorator_list);
  }
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  local_80 = &declaration_list->value;
  key.field_2._M_local_buf[0] = '\0';
  if ((declaration_list->value)._M_string_length == 0) {
    this_00 = &InstanceDecorators::non_cached_decorator_list;
    ::std::
    vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
    ::clear(&InstanceDecorators::non_cached_decorator_list);
  }
  else {
    ::std::__cxx11::string::reserve((ulong)&key);
    ::std::__cxx11::string::_M_assign((string *)&key);
    ::std::__cxx11::string::push_back((char)&key);
    if (source != (PropertySource *)0x0) {
      ::std::__cxx11::string::append((string *)&key);
    }
    iVar8 = robin_hood::detail::
            Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&this->decorator_cache,&key);
    if (iVar8.mKeyVals != (NodePtr)(this->decorator_cache).mInfo) {
      this_01 = (vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>
                 *)&((iVar8.mKeyVals)->mData).second;
      goto LAB_002c5662;
    }
    this_00 = robin_hood::detail::
              Table<true,80ul,std::__cxx11::string,std::vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              ::
              doCreateByKey<std::__cxx11::string_const&,std::vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>>
                        ((Table<true,80ul,std::__cxx11::string,std::vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                          *)&this->decorator_cache,&key);
  }
  local_88 = (vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>
              *)this_00;
  ::std::
  vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
  ::reserve(this_00,((long)(declaration_list->list).
                           super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(declaration_list->list).
                          super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x60);
  pDVar1 = (declaration_list->list).
           super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = local_88;
  for (key_00 = (declaration_list->list).
                super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_start; key_00 != pDVar1; key_00 = key_00 + 1) {
    decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pDVar2 = key_00->instancer;
    if (pDVar2 == (DecoratorInstancer *)0x0) {
      cVar9 = robin_hood::detail::
              Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&this->named_decorator_map,&key_00->type);
      pDVar4 = cVar9.mKeyVals;
      if (pDVar4 != (NodePtr)(this->named_decorator_map).mInfo) {
        pDVar2 = (pDVar4->mData).second.instancer;
        local_a0.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_78;
        local_a0.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
        local_90 = source;
        (*pDVar2->_vptr_DecoratorInstancer[2])
                  (&local_40,pDVar2,&(pDVar4->mData).second,&(pDVar4->mData).second.properties,
                   &local_a0);
        ::std::__shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>,
                   &local_40);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        this_01 = local_88;
      }
      pRVar5 = (RenderManager *)
               decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        pcVar6 = "";
        uVar7 = 0xffffffffffffffff;
        if (source != (PropertySource *)0x0) {
          pcVar6 = (source->path)._M_dataplus._M_p;
          uVar7 = (ulong)(uint)source->line_number;
        }
        Log::Message(LT_WARNING,
                     "Decorator name \'%s\' could not be found in any @decorator rule, declared at %s:%d"
                     ,(key_00->type)._M_dataplus._M_p,pcVar6,uVar7);
        goto LAB_002c5607;
      }
    }
    else {
      local_a0.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_78;
      local_a0.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
      local_90 = source;
      (*pDVar2->_vptr_DecoratorInstancer[2])(&local_40,pDVar2,key_00,&key_00->properties,&local_a0);
      ::std::__shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>,&local_40
                );
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      this_01 = local_88;
      pRVar5 = (RenderManager *)
               decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        pcVar6 = "";
        uVar7 = 0xffffffffffffffff;
        if (source != (PropertySource *)0x0) {
          pcVar6 = (source->path)._M_dataplus._M_p;
          uVar7 = (ulong)(uint)source->line_number;
        }
        Log::Message(LT_WARNING,
                     "Decorator \'%s\' in \'%s\' could not be instanced, declared at %s:%d",
                     (key_00->type)._M_dataplus._M_p,(local_80->_M_dataplus)._M_p,pcVar6,uVar7);
LAB_002c5607:
        pRVar5 = (RenderManager *)
                 decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          ::std::
          vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
          ::clear((vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                   *)this_01);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          break;
        }
      }
    }
    local_a0.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
    decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a0.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pRVar5;
    ::std::
    vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>
    ::emplace_back<std::shared_ptr<Rml::Decorator_const>>(this_01,&local_a0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a0.super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
LAB_002c5662:
  ::std::__cxx11::string::~string((string *)&key);
  *rmlui_nonrecursive.entered = false;
  return (DecoratorPtrList *)this_01;
}

Assistant:

const DecoratorPtrList& StyleSheet::InstanceDecorators(RenderManager& render_manager, const DecoratorDeclarationList& declaration_list,
	const PropertySource* source) const
{
	RMLUI_ASSERT_NONRECURSIVE; // Since we may return a reference to the below static variable.
	static DecoratorPtrList non_cached_decorator_list;

	// Empty declaration values are used for interpolated values which we don't want to cache.
	const bool enable_cache = !declaration_list.value.empty();

	// Generate the cache key. Relative paths of textures may be affected by the source path, and ultimately
	// which texture should be displayed. Thus, we need to include this path in the cache key.
	String key;

	if (enable_cache)
	{
		key.reserve(declaration_list.value.size() + 1 + (source ? source->path.size() : 0));
		key = declaration_list.value;
		key += ';';
		if (source)
			key += source->path;

		auto it_cache = decorator_cache.find(key);
		if (it_cache != decorator_cache.end())
			return it_cache->second;
	}
	else
	{
		non_cached_decorator_list.clear();
	}

	DecoratorPtrList& decorators = enable_cache ? decorator_cache[key] : non_cached_decorator_list;
	decorators.reserve(declaration_list.list.size());

	for (const DecoratorDeclaration& declaration : declaration_list.list)
	{
		SharedPtr<Decorator> decorator;

		if (declaration.instancer)
		{
			RMLUI_ZoneScopedN("InstanceDecorator");
			decorator = declaration.instancer->InstanceDecorator(declaration.type, declaration.properties,
				DecoratorInstancerInterface(render_manager, *this, source));

			if (!decorator)
				Log::Message(Log::LT_WARNING, "Decorator '%s' in '%s' could not be instanced, declared at %s:%d", declaration.type.c_str(),
					declaration_list.value.c_str(), source ? source->path.c_str() : "", source ? source->line_number : -1);
		}
		else
		{
			// If we have no instancer, this means the type is the name of an @decorator rule.
			auto it_map = named_decorator_map.find(declaration.type);
			if (it_map != named_decorator_map.end())
				decorator = it_map->second.instancer->InstanceDecorator(it_map->second.type, it_map->second.properties,
					DecoratorInstancerInterface(render_manager, *this, source));

			if (!decorator)
				Log::Message(Log::LT_WARNING, "Decorator name '%s' could not be found in any @decorator rule, declared at %s:%d",
					declaration.type.c_str(), source ? source->path.c_str() : "", source ? source->line_number : -1);
		}

		if (!decorator)
		{
			decorators.clear();
			break;
		}

		decorators.push_back(std::move(decorator));
	}

	return decorators;
}